

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1_element(CBB *cbb,CBS_ASN1_TAG tag,uint8_t *data,size_t data_len)

{
  int iVar1;
  undefined1 local_60 [8];
  CBB child;
  size_t data_len_local;
  uint8_t *data_local;
  CBS_ASN1_TAG tag_local;
  CBB *cbb_local;
  
  child.u._24_8_ = data_len;
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_60,tag);
  if (((iVar1 != 0) && (iVar1 = CBB_add_bytes((CBB *)local_60,data,child.u._24_8_), iVar1 != 0)) &&
     (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
    return 1;
  }
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_element(CBB *cbb, CBS_ASN1_TAG tag, const uint8_t *data,
                         size_t data_len) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag) ||
      !CBB_add_bytes(&child, data, data_len) ||  //
      !CBB_flush(cbb)) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}